

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkdiskcache_p.h
# Opt level: O0

void __thiscall QNetworkDiskCachePrivate::~QNetworkDiskCachePrivate(QNetworkDiskCachePrivate *this)

{
  QCacheItem *in_RDI;
  
  (in_RDI->metaData).d.d.ptr =
       (QNetworkCacheMetaDataPrivate *)&PTR__QNetworkDiskCachePrivate_0049d500;
  QHash<QIODevice_*,_QCacheItem_*>::~QHash((QHash<QIODevice_*,_QCacheItem_*> *)in_RDI);
  QString::~QString((QString *)0x287b12);
  QString::~QString((QString *)0x287b23);
  QCacheItem::~QCacheItem(in_RDI);
  QAbstractNetworkCachePrivate::~QAbstractNetworkCachePrivate
            ((QAbstractNetworkCachePrivate *)0x287b3b);
  return;
}

Assistant:

QNetworkDiskCachePrivate()
        : QAbstractNetworkCachePrivate()
        , maximumCacheSize(1024 * 1024 * 50)
        , currentCacheSize(-1)
        {}